

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libixy-vfio.c
# Opt level: O0

int vfio_disable_msix(int device_fd)

{
  int iVar1;
  int *piVar2;
  int in_EDI;
  char buf [512];
  int err;
  int64_t result;
  char irq_set_buf [152];
  vfio_irq_set *irq_set;
  undefined1 local_2b8 [516];
  int local_b4;
  long local_b0;
  undefined4 local_a8;
  undefined4 local_a4;
  undefined4 local_a0;
  undefined4 local_9c;
  undefined4 local_98;
  undefined4 *local_10;
  int local_4;
  
  local_4 = in_EDI;
  fprintf(_stdout,"[INFO ] %s:%d %s(): Disable MSIX Interrupts\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c",0x81,
          "vfio_disable_msix");
  local_10 = &local_a8;
  local_a8 = 0x14;
  local_98 = 0;
  local_a4 = 0x21;
  local_a0 = 2;
  local_9c = 0;
  iVar1 = ioctl(local_4,0x3b6e,local_10);
  local_b0 = (long)iVar1;
  if (local_b0 == -1) {
    piVar2 = __errno_location();
    local_b4 = *piVar2;
    __xpg_strerror_r(local_b4,local_2b8,0x200);
    fprintf(_stderr,"[ERROR] %s:%d %s(): Failed to %s: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c",
            0x8c,"vfio_disable_msix","disable MSIX interrupt",local_2b8);
    exit(local_b4);
  }
  return 0;
}

Assistant:

int vfio_disable_msix(int device_fd) {
	info("Disable MSIX Interrupts");
	struct vfio_irq_set* irq_set;
	char irq_set_buf[MSIX_IRQ_SET_BUF_LEN];

	irq_set = (struct vfio_irq_set*) irq_set_buf;
	irq_set->argsz = sizeof(struct vfio_irq_set);
	irq_set->count = 0;
	irq_set->flags = VFIO_IRQ_SET_DATA_NONE | VFIO_IRQ_SET_ACTION_TRIGGER;
	irq_set->index = VFIO_PCI_MSIX_IRQ_INDEX;
	irq_set->start = 0;

	check_err(ioctl(device_fd, VFIO_DEVICE_SET_IRQS, irq_set), "disable MSIX interrupt");

	return 0;
}